

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O1

int __thiscall cmCPackArchiveGenerator::InitializeInternal(cmCPackArchiveGenerator *this)

{
  int iVar1;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"CPACK_INCLUDE_TOPLEVEL_DIRECTORY","");
  cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_38,"1");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  iVar1 = cmCPackGenerator::InitializeInternal(&this->super_cmCPackGenerator);
  return iVar1;
}

Assistant:

int cmCPackArchiveGenerator::InitializeInternal()
{
  this->SetOptionIfNotSet("CPACK_INCLUDE_TOPLEVEL_DIRECTORY", "1");
  return this->Superclass::InitializeInternal();
}